

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stats_general_print(emitter_t *emitter)

{
  emitter_t *peVar1;
  int iVar2;
  tsd_t *ptVar3;
  tsd_t *ptVar4;
  ulong uVar5;
  char *pcVar6;
  size_t *value;
  uint i;
  _Bool bv;
  size_t sv;
  uint uv;
  char *cpv;
  size_t bsz;
  _Bool bv2;
  size_t ssz;
  size_t cpsz;
  size_t miblen_new;
  ssize_t ssv;
  emitter_t *local_e0;
  size_t sssz;
  size_t usz;
  uint32_t u32v;
  size_t sz_20;
  uint nlextents;
  uint arenas_nbins;
  int64_t i64v;
  size_t sz;
  ulong local_98;
  uint64_t u64v;
  uint arenas_nhbins;
  size_t i64sz;
  size_t u64sz;
  ssize_t ssv2;
  ulong local_40;
  size_t u32sz;
  
  bsz = 1;
  usz = 4;
  ssz = 8;
  sssz = 8;
  cpsz = 8;
  u32sz = 4;
  i64sz = 8;
  u64sz = 8;
  sz = 8;
  iVar2 = duckdb_je_mallctl("version",&cpv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "version";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"version","Version",emitter_type_string,&cpv);
  emitter_dict_begin(emitter,"config","Build-time option settings");
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.cache_oblivious",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.cache_oblivious";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"cache_oblivious","config.cache_oblivious",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.debug",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.debug";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"debug","config.debug",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.fill",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.fill";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"fill","config.fill",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.lazy_lock",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.lazy_lock";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"lazy_lock","config.lazy_lock",emitter_type_bool,&bv);
  emitter_kv(emitter,"malloc_conf","config.malloc_conf",emitter_type_string,&config_malloc_conf);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.opt_safety_checks",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.opt_safety_checks";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"opt_safety_checks","config.opt_safety_checks",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.prof",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.prof";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"prof","config.prof",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.prof_libgcc",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.prof_libgcc";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"prof_libgcc","config.prof_libgcc",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.prof_libunwind",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.prof_libunwind";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"prof_libunwind","config.prof_libunwind",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.stats",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.stats";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"stats","config.stats",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.utrace",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.utrace";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"utrace","config.utrace",emitter_type_bool,&bv);
  sz = 1;
  iVar2 = duckdb_je_mallctl("config.xmalloc",&bv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "config.xmalloc";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"xmalloc","config.xmalloc",emitter_type_bool,&bv);
  emitter_dict_end(emitter);
  emitter_dict_begin(emitter,"opt","Run-time option settings");
  iVar2 = duckdb_je_mallctl("opt.malloc_conf.global_var",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 != 0) {
    cpv = anon_var_dwarf_4b0ffdd + 9;
  }
  emitter_kv(emitter,"global_var","Global variable malloc_conf",emitter_type_string,&cpv);
  iVar2 = duckdb_je_mallctl("opt.malloc_conf.symlink",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 != 0) {
    cpv = anon_var_dwarf_4b0ffdd + 9;
  }
  emitter_kv(emitter,"symlink","Symbolic link malloc.conf",emitter_type_string,&cpv);
  iVar2 = duckdb_je_mallctl("opt.malloc_conf.env_var",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 != 0) {
    cpv = anon_var_dwarf_4b0ffdd + 9;
  }
  emitter_kv(emitter,"env_var","Environment variable MALLOC_CONF",emitter_type_string,&cpv);
  iVar2 = duckdb_je_mallctl("opt.malloc_conf.global_var_2_conf_harder",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"global_var_2_conf_harder","Global variable malloc_conf_2_conf_harder",
               emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.abort",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"abort","opt.abort",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.abort_conf",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"abort_conf","opt.abort_conf",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.cache_oblivious",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"cache_oblivious","opt.cache_oblivious",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.confirm_conf",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"confirm_conf","opt.confirm_conf",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.retain",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"retain","opt.retain",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.dss",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"dss","opt.dss",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.narenas",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"narenas","opt.narenas",emitter_type_unsigned,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.percpu_arena",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"percpu_arena","opt.percpu_arena",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.oversize_threshold",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"oversize_threshold","opt.oversize_threshold",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa","opt.hpa",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_slab_max_alloc",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_slab_max_alloc","opt.hpa_slab_max_alloc",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_hugification_threshold",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_hugification_threshold","opt.hpa_hugification_threshold",
               emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_hugify_delay_ms",&u64v,&u64sz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_hugify_delay_ms","opt.hpa_hugify_delay_ms",emitter_type_uint64,&u64v);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_min_purge_interval_ms",&u64v,&u64sz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_min_purge_interval_ms","opt.hpa_min_purge_interval_ms",
               emitter_type_uint64,&u64v);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_strict_min_purge_interval",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_strict_min_purge_interval","opt.hpa_strict_min_purge_interval",
               emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_dirty_mult",&u32v,&u32sz,(void *)0x0,0);
  if (iVar2 == 0) {
    if (u32v == 0xffffffff) {
      value = &sz;
      sz = (long)
           "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. sample_size=-1"
           + 0x6b;
    }
    else {
      duckdb_je_fxp_print(u32v,(char *)&sz);
      value = (size_t *)&i64v;
      i64v = (int64_t)&sz;
    }
    emitter_kv(emitter,"hpa_dirty_mult","opt.hpa_dirty_mult",emitter_type_string,value);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_sec_nshards",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_sec_nshards","opt.hpa_sec_nshards",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_sec_max_alloc",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_sec_max_alloc","opt.hpa_sec_max_alloc",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_sec_max_bytes",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_sec_max_bytes","opt.hpa_sec_max_bytes",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_sec_bytes_after_flush",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_sec_bytes_after_flush","opt.hpa_sec_bytes_after_flush",emitter_type_size
               ,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.hpa_sec_batch_fill_extra",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"hpa_sec_batch_fill_extra","opt.hpa_sec_batch_fill_extra",emitter_type_size,
               &sv);
  }
  iVar2 = duckdb_je_mallctl("opt.metadata_thp",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"metadata_thp","opt.metadata_thp",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.mutex_max_spin",&i64v,&i64sz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"mutex_max_spin","opt.mutex_max_spin",emitter_type_int64,&i64v);
  }
  iVar2 = duckdb_je_mallctl("opt.background_thread",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl("background_thread",&bv2,&bsz,(void *)0x0,0);
    if (iVar2 == 0) {
      emitter_kv_note(emitter,"background_thread","opt.background_thread",emitter_type_bool,&bv,
                      "background_thread",emitter_type_bool,&bv2);
    }
  }
  iVar2 = duckdb_je_mallctl("opt.dirty_decay_ms",&ssv,&sssz,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl("arenas.dirty_decay_ms",&ssv2,&sssz,(void *)0x0,0);
    if (iVar2 == 0) {
      emitter_kv_note(emitter,"dirty_decay_ms","opt.dirty_decay_ms",emitter_type_ssize,&ssv,
                      "arenas.dirty_decay_ms",emitter_type_ssize,&ssv2);
    }
  }
  iVar2 = duckdb_je_mallctl("opt.muzzy_decay_ms",&ssv,&sssz,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl("arenas.muzzy_decay_ms",&ssv2,&sssz,(void *)0x0,0);
    if (iVar2 == 0) {
      emitter_kv_note(emitter,"muzzy_decay_ms","opt.muzzy_decay_ms",emitter_type_ssize,&ssv,
                      "arenas.muzzy_decay_ms",emitter_type_ssize,&ssv2);
    }
  }
  iVar2 = duckdb_je_mallctl("opt.lg_extent_max_active_fit",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"lg_extent_max_active_fit","opt.lg_extent_max_active_fit",emitter_type_size,
               &sv);
  }
  iVar2 = duckdb_je_mallctl("opt.junk",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"junk","opt.junk",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.zero",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"zero","opt.zero",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.utrace",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"utrace","opt.utrace",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.xmalloc",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"xmalloc","opt.xmalloc",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.experimental_infallible_new",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"experimental_infallible_new","opt.experimental_infallible_new",
               emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.max_batched_size",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"max_batched_size","opt.max_batched_size",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.remote_free_max",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"remote_free_max","opt.remote_free_max",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.remote_free_max_batch",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"remote_free_max_batch","opt.remote_free_max_batch",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache","opt.tcache",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache_max",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_max","opt.tcache_max",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache_nslots_small_min",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_nslots_small_min","opt.tcache_nslots_small_min",emitter_type_unsigned
               ,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache_nslots_small_max",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_nslots_small_max","opt.tcache_nslots_small_max",emitter_type_unsigned
               ,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache_nslots_large",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_nslots_large","opt.tcache_nslots_large",emitter_type_unsigned,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.lg_tcache_nslots_mul",&ssv,&sssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"lg_tcache_nslots_mul","opt.lg_tcache_nslots_mul",emitter_type_ssize,&ssv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache_gc_incr_bytes",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_gc_incr_bytes","opt.tcache_gc_incr_bytes",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.tcache_gc_delay_bytes",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_gc_delay_bytes","opt.tcache_gc_delay_bytes",emitter_type_size,&sv);
  }
  iVar2 = duckdb_je_mallctl("opt.lg_tcache_flush_small_div",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"lg_tcache_flush_small_div","opt.lg_tcache_flush_small_div",
               emitter_type_unsigned,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.lg_tcache_flush_large_div",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"lg_tcache_flush_large_div","opt.lg_tcache_flush_large_div",
               emitter_type_unsigned,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.debug_double_free_max_scan",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"debug_double_free_max_scan","opt.debug_double_free_max_scan",
               emitter_type_unsigned,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.thp",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"thp","opt.thp",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof","opt.prof",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_bt_max",&uv,&usz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_bt_max","opt.prof_bt_max",emitter_type_unsigned,&uv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_prefix",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_prefix","opt.prof_prefix",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_active",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl("prof.active",&bv2,&bsz,(void *)0x0,0);
    if (iVar2 == 0) {
      emitter_kv_note(emitter,"prof_active","opt.prof_active",emitter_type_bool,&bv,"prof.active",
                      emitter_type_bool,&bv2);
    }
  }
  iVar2 = duckdb_je_mallctl("opt.prof_thread_active_init",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl("prof.thread_active_init",&bv2,&bsz,(void *)0x0,0);
    if (iVar2 == 0) {
      emitter_kv_note(emitter,"prof_thread_active_init","opt.prof_thread_active_init",
                      emitter_type_bool,&bv,"prof.thread_active_init",emitter_type_bool,&bv2);
    }
  }
  iVar2 = duckdb_je_mallctl("opt.lg_prof_sample",&ssv,&sssz,(void *)0x0,0);
  if (iVar2 == 0) {
    iVar2 = duckdb_je_mallctl("prof.lg_sample",&ssv2,&sssz,(void *)0x0,0);
    if (iVar2 == 0) {
      emitter_kv_note(emitter,"lg_prof_sample","opt.lg_prof_sample",emitter_type_ssize,&ssv,
                      "prof.lg_sample",emitter_type_ssize,&ssv2);
    }
  }
  iVar2 = duckdb_je_mallctl("opt.prof_accum",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_accum","opt.prof_accum",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.lg_prof_interval",&ssv,&sssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"lg_prof_interval","opt.lg_prof_interval",emitter_type_ssize,&ssv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_gdump",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_gdump","opt.prof_gdump",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_final",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_final","opt.prof_final",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_leak",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_leak","opt.prof_leak",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.prof_leak_error",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"prof_leak_error","opt.prof_leak_error",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.stats_print",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"stats_print","opt.stats_print",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.stats_print_opts",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"stats_print_opts","opt.stats_print_opts",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.stats_print",&bv,&bsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"stats_print","opt.stats_print",emitter_type_bool,&bv);
  }
  iVar2 = duckdb_je_mallctl("opt.stats_print_opts",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"stats_print_opts","opt.stats_print_opts",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.stats_interval",&i64v,&i64sz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"stats_interval","opt.stats_interval",emitter_type_int64,&i64v);
  }
  iVar2 = duckdb_je_mallctl("opt.stats_interval_opts",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"stats_interval_opts","opt.stats_interval_opts",emitter_type_string,&cpv);
  }
  iVar2 = duckdb_je_mallctl("opt.zero_realloc",&cpv,&cpsz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"zero_realloc","opt.zero_realloc",emitter_type_string,&cpv);
  }
  emitter_dict_end(emitter);
  emitter_json_object_kv_begin(emitter,"arenas");
  sz = 4;
  iVar2 = duckdb_je_mallctl("arenas.narenas",&uv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.narenas";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"narenas","Arenas",emitter_type_unsigned,&uv);
  sz = 8;
  iVar2 = duckdb_je_mallctl("arenas.dirty_decay_ms",&ssv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.dirty_decay_ms";
    goto LAB_0120c439;
  }
  emitter_json_kv(emitter,"dirty_decay_ms",emitter_type_ssize,&ssv);
  sz = 8;
  iVar2 = duckdb_je_mallctl("arenas.muzzy_decay_ms",&ssv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.muzzy_decay_ms";
    goto LAB_0120c439;
  }
  emitter_json_kv(emitter,"muzzy_decay_ms",emitter_type_ssize,&ssv);
  sz = 8;
  iVar2 = duckdb_je_mallctl("arenas.quantum",&sv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.quantum";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"quantum","Quantum size",emitter_type_size,&sv);
  sz = 8;
  iVar2 = duckdb_je_mallctl("arenas.page",&sv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.page";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"page","Page size",emitter_type_size,&sv);
  sz = 8;
  iVar2 = duckdb_je_mallctl("arenas.hugepage",&sv,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.hugepage";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"hugepage","Hugepage size",emitter_type_size,&sv);
  iVar2 = duckdb_je_mallctl("arenas.tcache_max",&sv,&ssz,(void *)0x0,0);
  if (iVar2 == 0) {
    emitter_kv(emitter,"tcache_max","Maximum thread-cached size class",emitter_type_size,&sv);
  }
  sz = 4;
  iVar2 = duckdb_je_mallctl("arenas.nbins",&arenas_nbins,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.nbins";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"nbins","Number of bin size classes",emitter_type_unsigned,&arenas_nbins);
  sz = 4;
  iVar2 = duckdb_je_mallctl("arenas.nhbins",&arenas_nhbins,&sz,(void *)0x0,0);
  if (iVar2 != 0) {
    pcVar6 = "arenas.nhbins";
    goto LAB_0120c439;
  }
  emitter_kv(emitter,"nhbins","Number of thread-cache bin size classes",emitter_type_unsigned,
             &arenas_nhbins);
  local_e0 = emitter;
  if (emitter->output < emitter_output_table) {
    emitter_json_array_kv_begin(emitter,"bin");
    miblen_new = 7;
    ptVar3 = (tsd_t *)__tls_get_addr(&PTR_027eeb58);
    ptVar4 = ptVar3;
    if ((ptVar3->state).repr != '\0') {
      ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
    }
    iVar2 = duckdb_je_ctl_mibnametomib(ptVar4,&sz,0,"arenas.bin",&miblen_new);
    if (iVar2 == 0) {
      uVar5 = 0;
      while (emitter = local_e0, uVar5 < arenas_nbins) {
        local_98 = uVar5;
        local_40 = uVar5;
        emitter_json_object_begin(local_e0);
        miblen_new = 7;
        sz_20 = 8;
        ptVar4 = ptVar3;
        if ((ptVar3->state).repr != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
        }
        iVar2 = duckdb_je_ctl_bymibname(ptVar4,&sz,3,"size",&miblen_new,&sv,&sz_20,(void *)0x0,0);
        if (iVar2 != 0) goto LAB_0120c2a7;
        emitter_json_kv(local_e0,"size",emitter_type_size,&sv);
        miblen_new = 7;
        sz_20 = 4;
        ptVar4 = ptVar3;
        if ((ptVar3->state).repr != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
        }
        iVar2 = duckdb_je_ctl_bymibname(ptVar4,&sz,3,"nregs",&miblen_new,&u32v,&sz_20,(void *)0x0,0)
        ;
        if (iVar2 != 0) goto LAB_0120c2a7;
        emitter_json_kv(local_e0,"nregs",emitter_type_uint32,&u32v);
        miblen_new = 7;
        sz_20 = 8;
        ptVar4 = ptVar3;
        if ((ptVar3->state).repr != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
        }
        iVar2 = duckdb_je_ctl_bymibname
                          (ptVar4,&sz,3,"slab_size",&miblen_new,&sv,&sz_20,(void *)0x0,0);
        if (iVar2 != 0) goto LAB_0120c2a7;
        emitter_json_kv(local_e0,"slab_size",emitter_type_size,&sv);
        miblen_new = 7;
        sz_20 = 4;
        ptVar4 = ptVar3;
        if ((ptVar3->state).repr != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
        }
        iVar2 = duckdb_je_ctl_bymibname
                          (ptVar4,&sz,3,"nshards",&miblen_new,&u32v,&sz_20,(void *)0x0,0);
        peVar1 = local_e0;
        if (iVar2 != 0) goto LAB_0120c2a7;
        emitter_json_kv(local_e0,"nshards",emitter_type_uint32,&u32v);
        emitter_json_object_end(peVar1);
        uVar5 = local_40 + 1;
      }
      emitter_json_array_end(local_e0);
      goto LAB_0120c0e8;
    }
  }
  else {
LAB_0120c0e8:
    sz = 4;
    iVar2 = duckdb_je_mallctl("arenas.nlextents",&nlextents,&sz,(void *)0x0,0);
    if (iVar2 != 0) {
      pcVar6 = "arenas.nlextents";
LAB_0120c439:
      duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar6);
      abort();
    }
    emitter_kv(emitter,"nlextents","Number of large size classes",emitter_type_unsigned,&nlextents);
    if (emitter_output_json_compact < emitter->output) {
LAB_0120c269:
      emitter_json_object_end(emitter);
      return;
    }
    emitter_json_array_kv_begin(emitter,"lextent");
    miblen_new = 7;
    ptVar3 = (tsd_t *)__tls_get_addr(&PTR_027eeb58);
    ptVar4 = ptVar3;
    if ((ptVar3->state).repr != '\0') {
      ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
    }
    iVar2 = duckdb_je_ctl_mibnametomib(ptVar4,&sz,0,"arenas.lextent",&miblen_new);
    peVar1 = local_e0;
    if (iVar2 == 0) {
      for (uVar5 = 0; emitter = local_e0, uVar5 < nlextents; uVar5 = uVar5 + 1) {
        local_98 = uVar5;
        emitter_json_object_begin(local_e0);
        miblen_new = 7;
        sz_20 = 8;
        ptVar4 = ptVar3;
        if ((ptVar3->state).repr != '\0') {
          ptVar4 = duckdb_je_tsd_fetch_slow(ptVar3,false);
        }
        iVar2 = duckdb_je_ctl_bymibname(ptVar4,&sz,3,"size",&miblen_new,&sv,&sz_20,(void *)0x0,0);
        if (iVar2 != 0) goto LAB_0120c2a7;
        emitter_json_kv(peVar1,"size",emitter_type_size,&sv);
        emitter_json_object_end(peVar1);
      }
      emitter_json_array_end(local_e0);
      goto LAB_0120c269;
    }
  }
  pcVar6 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
LAB_0120c2ae:
  duckdb_je_malloc_write(pcVar6);
  abort();
LAB_0120c2a7:
  pcVar6 = "<jemalloc>: Failure in ctl_bymibname()\n";
  goto LAB_0120c2ae;
}

Assistant:

JEMALLOC_COLD
static void
stats_general_print(emitter_t *emitter) {
	const char *cpv;
	bool bv, bv2;
	unsigned uv;
	uint32_t u32v;
	uint64_t u64v;
	int64_t i64v;
	ssize_t ssv, ssv2;
	size_t sv, bsz, usz, u32sz, u64sz, i64sz, ssz, sssz, cpsz;

	bsz = sizeof(bool);
	usz = sizeof(unsigned);
	ssz = sizeof(size_t);
	sssz = sizeof(ssize_t);
	cpsz = sizeof(const char *);
	u32sz = sizeof(uint32_t);
	i64sz = sizeof(int64_t);
	u64sz = sizeof(uint64_t);

	CTL_GET("version", &cpv, const char *);
	emitter_kv(emitter, "version", "Version", emitter_type_string, &cpv);

	/* config. */
	emitter_dict_begin(emitter, "config", "Build-time option settings");
#define CONFIG_WRITE_BOOL(name)						\
	do {								\
		CTL_GET("config."#name, &bv, bool);			\
		emitter_kv(emitter, #name, "config."#name,		\
		    emitter_type_bool, &bv);				\
	} while (0)

	CONFIG_WRITE_BOOL(cache_oblivious);
	CONFIG_WRITE_BOOL(debug);
	CONFIG_WRITE_BOOL(fill);
	CONFIG_WRITE_BOOL(lazy_lock);
	emitter_kv(emitter, "malloc_conf", "config.malloc_conf",
	    emitter_type_string, &config_malloc_conf);

	CONFIG_WRITE_BOOL(opt_safety_checks);
	CONFIG_WRITE_BOOL(prof);
	CONFIG_WRITE_BOOL(prof_libgcc);
	CONFIG_WRITE_BOOL(prof_libunwind);
	CONFIG_WRITE_BOOL(stats);
	CONFIG_WRITE_BOOL(utrace);
	CONFIG_WRITE_BOOL(xmalloc);
#undef CONFIG_WRITE_BOOL
	emitter_dict_end(emitter); /* Close "config" dict. */

	/* opt. */
#define OPT_WRITE(name, var, size, emitter_type)			\
	if (je_mallctl("opt."name, (void *)&var, &size, NULL, 0) ==	\
	    0) {							\
		emitter_kv(emitter, name, "opt."name, emitter_type,	\
		    &var);						\
	}

#define OPT_WRITE_MUTABLE(name, var1, var2, size, emitter_type,		\
    altname)								\
	if (je_mallctl("opt."name, (void *)&var1, &size, NULL, 0) ==	\
	    0 && je_mallctl(altname, (void *)&var2, &size, NULL, 0)	\
	    == 0) {							\
		emitter_kv_note(emitter, name, "opt."name,		\
		    emitter_type, &var1, altname, emitter_type,		\
		    &var2);						\
	}

#define OPT_WRITE_BOOL(name) OPT_WRITE(name, bv, bsz, emitter_type_bool)
#define OPT_WRITE_BOOL_MUTABLE(name, altname)				\
	OPT_WRITE_MUTABLE(name, bv, bv2, bsz, emitter_type_bool, altname)

#define OPT_WRITE_UNSIGNED(name)					\
	OPT_WRITE(name, uv, usz, emitter_type_unsigned)

#define OPT_WRITE_INT64(name)						\
	OPT_WRITE(name, i64v, i64sz, emitter_type_int64)
#define OPT_WRITE_UINT64(name)						\
	OPT_WRITE(name, u64v, u64sz, emitter_type_uint64)

#define OPT_WRITE_SIZE_T(name)						\
	OPT_WRITE(name, sv, ssz, emitter_type_size)
#define OPT_WRITE_SSIZE_T(name)						\
	OPT_WRITE(name, ssv, sssz, emitter_type_ssize)
#define OPT_WRITE_SSIZE_T_MUTABLE(name, altname)			\
	OPT_WRITE_MUTABLE(name, ssv, ssv2, sssz, emitter_type_ssize,	\
	    altname)

#define OPT_WRITE_CHAR_P(name)						\
	OPT_WRITE(name, cpv, cpsz, emitter_type_string)

	emitter_dict_begin(emitter, "opt", "Run-time option settings");

	/*
	 * opt.malloc_conf.
	 *
	 * Sources are documented in https://jemalloc.net/jemalloc.3.html#tuning
	 * - (Not Included Here) The string specified via --with-malloc-conf,
	 *     which is already printed out above as config.malloc_conf
	 * - (Included) The string pointed to by the global variable malloc_conf
	 * - (Included) The “name” of the file referenced by the symbolic link
	 *     named /etc/malloc.conf
	 * - (Included) The value of the environment variable MALLOC_CONF
	 * - (Optional, Unofficial) The string pointed to by the global variable
	 *     malloc_conf_2_conf_harder, which is hidden from the public.
	 *
	 * Note: The outputs are strictly ordered by priorities (low -> high).
	 *
	 */
#define MALLOC_CONF_WRITE(name, message)					\
	if (je_mallctl("opt.malloc_conf."name, (void *)&cpv, &cpsz, NULL, 0) !=	\
	    0) {								\
		cpv = "";							\
	}									\
	emitter_kv(emitter, name, message, emitter_type_string,	&cpv);

	MALLOC_CONF_WRITE("global_var", "Global variable malloc_conf");
	MALLOC_CONF_WRITE("symlink", "Symbolic link malloc.conf");
	MALLOC_CONF_WRITE("env_var", "Environment variable MALLOC_CONF");
	/* As this config is unofficial, skip the output if it's NULL */
	if (je_mallctl("opt.malloc_conf.global_var_2_conf_harder",
	    (void *)&cpv, &cpsz, NULL, 0) == 0) {
		emitter_kv(emitter, "global_var_2_conf_harder", "Global "
		    "variable malloc_conf_2_conf_harder", emitter_type_string, &cpv);
	}
#undef MALLOC_CONF_WRITE

	OPT_WRITE_BOOL("abort")
	OPT_WRITE_BOOL("abort_conf")
	OPT_WRITE_BOOL("cache_oblivious")
	OPT_WRITE_BOOL("confirm_conf")
	OPT_WRITE_BOOL("retain")
	OPT_WRITE_CHAR_P("dss")
	OPT_WRITE_UNSIGNED("narenas")
	OPT_WRITE_CHAR_P("percpu_arena")
	OPT_WRITE_SIZE_T("oversize_threshold")
	OPT_WRITE_BOOL("hpa")
	OPT_WRITE_SIZE_T("hpa_slab_max_alloc")
	OPT_WRITE_SIZE_T("hpa_hugification_threshold")
	OPT_WRITE_UINT64("hpa_hugify_delay_ms")
	OPT_WRITE_UINT64("hpa_min_purge_interval_ms")
	OPT_WRITE_BOOL("hpa_strict_min_purge_interval")
	if (je_mallctl("opt.hpa_dirty_mult", (void *)&u32v, &u32sz, NULL, 0)
	    == 0) {
		/*
		 * We cheat a little and "know" the secret meaning of this
		 * representation.
		 */
		if (u32v == (uint32_t)-1) {
			const char *neg1 = "-1";
			emitter_kv(emitter, "hpa_dirty_mult",
			    "opt.hpa_dirty_mult", emitter_type_string, &neg1);
		} else {
			char buf[FXP_BUF_SIZE];
			fxp_print(u32v, buf);
			const char *bufp = buf;
			emitter_kv(emitter, "hpa_dirty_mult",
			    "opt.hpa_dirty_mult", emitter_type_string, &bufp);
		}
	}
	OPT_WRITE_SIZE_T("hpa_sec_nshards")
	OPT_WRITE_SIZE_T("hpa_sec_max_alloc")
	OPT_WRITE_SIZE_T("hpa_sec_max_bytes")
	OPT_WRITE_SIZE_T("hpa_sec_bytes_after_flush")
	OPT_WRITE_SIZE_T("hpa_sec_batch_fill_extra")
	OPT_WRITE_CHAR_P("metadata_thp")
	OPT_WRITE_INT64("mutex_max_spin")
	OPT_WRITE_BOOL_MUTABLE("background_thread", "background_thread")
	OPT_WRITE_SSIZE_T_MUTABLE("dirty_decay_ms", "arenas.dirty_decay_ms")
	OPT_WRITE_SSIZE_T_MUTABLE("muzzy_decay_ms", "arenas.muzzy_decay_ms")
	OPT_WRITE_SIZE_T("lg_extent_max_active_fit")
	OPT_WRITE_CHAR_P("junk")
	OPT_WRITE_BOOL("zero")
	OPT_WRITE_BOOL("utrace")
	OPT_WRITE_BOOL("xmalloc")
	OPT_WRITE_BOOL("experimental_infallible_new")
	OPT_WRITE_SIZE_T("max_batched_size")
	OPT_WRITE_SIZE_T("remote_free_max")
	OPT_WRITE_SIZE_T("remote_free_max_batch")
	OPT_WRITE_BOOL("tcache")
	OPT_WRITE_SIZE_T("tcache_max")
	OPT_WRITE_UNSIGNED("tcache_nslots_small_min")
	OPT_WRITE_UNSIGNED("tcache_nslots_small_max")
	OPT_WRITE_UNSIGNED("tcache_nslots_large")
	OPT_WRITE_SSIZE_T("lg_tcache_nslots_mul")
	OPT_WRITE_SIZE_T("tcache_gc_incr_bytes")
	OPT_WRITE_SIZE_T("tcache_gc_delay_bytes")
	OPT_WRITE_UNSIGNED("lg_tcache_flush_small_div")
	OPT_WRITE_UNSIGNED("lg_tcache_flush_large_div")
	OPT_WRITE_UNSIGNED("debug_double_free_max_scan")
	OPT_WRITE_CHAR_P("thp")
	OPT_WRITE_BOOL("prof")
	OPT_WRITE_UNSIGNED("prof_bt_max")
	OPT_WRITE_CHAR_P("prof_prefix")
	OPT_WRITE_BOOL_MUTABLE("prof_active", "prof.active")
	OPT_WRITE_BOOL_MUTABLE("prof_thread_active_init",
	    "prof.thread_active_init")
	OPT_WRITE_SSIZE_T_MUTABLE("lg_prof_sample", "prof.lg_sample")
	OPT_WRITE_BOOL("prof_accum")
	OPT_WRITE_SSIZE_T("lg_prof_interval")
	OPT_WRITE_BOOL("prof_gdump")
	OPT_WRITE_BOOL("prof_final")
	OPT_WRITE_BOOL("prof_leak")
	OPT_WRITE_BOOL("prof_leak_error")
	OPT_WRITE_BOOL("stats_print")
	OPT_WRITE_CHAR_P("stats_print_opts")
	OPT_WRITE_BOOL("stats_print")
	OPT_WRITE_CHAR_P("stats_print_opts")
	OPT_WRITE_INT64("stats_interval")
	OPT_WRITE_CHAR_P("stats_interval_opts")
	OPT_WRITE_CHAR_P("zero_realloc")

	emitter_dict_end(emitter); /* Close "opt". */

#undef OPT_WRITE
#undef OPT_WRITE_MUTABLE
#undef OPT_WRITE_BOOL
#undef OPT_WRITE_BOOL_MUTABLE
#undef OPT_WRITE_UNSIGNED
#undef OPT_WRITE_SSIZE_T
#undef OPT_WRITE_SSIZE_T_MUTABLE
#undef OPT_WRITE_CHAR_P

	/* prof. */
	if (config_prof) {
		emitter_dict_begin(emitter, "prof", "Profiling settings");

		CTL_GET("prof.thread_active_init", &bv, bool);
		emitter_kv(emitter, "thread_active_init",
		    "prof.thread_active_init", emitter_type_bool, &bv);

		CTL_GET("prof.active", &bv, bool);
		emitter_kv(emitter, "active", "prof.active", emitter_type_bool,
		    &bv);

		CTL_GET("prof.gdump", &bv, bool);
		emitter_kv(emitter, "gdump", "prof.gdump", emitter_type_bool,
		    &bv);

		CTL_GET("prof.interval", &u64v, uint64_t);
		emitter_kv(emitter, "interval", "prof.interval",
		    emitter_type_uint64, &u64v);

		CTL_GET("prof.lg_sample", &ssv, ssize_t);
		emitter_kv(emitter, "lg_sample", "prof.lg_sample",
		    emitter_type_ssize, &ssv);

		emitter_dict_end(emitter); /* Close "prof". */
	}

	/* arenas. */
	/*
	 * The json output sticks arena info into an "arenas" dict; the table
	 * output puts them at the top-level.
	 */
	emitter_json_object_kv_begin(emitter, "arenas");

	CTL_GET("arenas.narenas", &uv, unsigned);
	emitter_kv(emitter, "narenas", "Arenas", emitter_type_unsigned, &uv);

	/*
	 * Decay settings are emitted only in json mode; in table mode, they're
	 * emitted as notes with the opt output, above.
	 */
	CTL_GET("arenas.dirty_decay_ms", &ssv, ssize_t);
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize, &ssv);

	CTL_GET("arenas.muzzy_decay_ms", &ssv, ssize_t);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize, &ssv);

	CTL_GET("arenas.quantum", &sv, size_t);
	emitter_kv(emitter, "quantum", "Quantum size", emitter_type_size, &sv);

	CTL_GET("arenas.page", &sv, size_t);
	emitter_kv(emitter, "page", "Page size", emitter_type_size, &sv);

	CTL_GET("arenas.hugepage", &sv, size_t);
	emitter_kv(emitter, "hugepage", "Hugepage size", emitter_type_size,
	    &sv);

	if (je_mallctl("arenas.tcache_max", (void *)&sv, &ssz, NULL, 0) == 0) {
		emitter_kv(emitter, "tcache_max",
		    "Maximum thread-cached size class", emitter_type_size, &sv);
	}

	unsigned arenas_nbins;
	CTL_GET("arenas.nbins", &arenas_nbins, unsigned);
	emitter_kv(emitter, "nbins", "Number of bin size classes",
	    emitter_type_unsigned, &arenas_nbins);

	unsigned arenas_nhbins;
	CTL_GET("arenas.nhbins", &arenas_nhbins, unsigned);
	emitter_kv(emitter, "nhbins", "Number of thread-cache bin size classes",
	    emitter_type_unsigned, &arenas_nhbins);

	/*
	 * We do enough mallctls in a loop that we actually want to omit them
	 * (not just omit the printing).
	 */
	if (emitter_outputs_json(emitter)) {
		emitter_json_array_kv_begin(emitter, "bin");
		size_t arenas_bin_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(arenas_bin_mib, 0, "arenas.bin");
		for (unsigned i = 0; i < arenas_nbins; i++) {
			arenas_bin_mib[2] = i;
			emitter_json_object_begin(emitter);

			CTL_LEAF(arenas_bin_mib, 3, "size", &sv, size_t);
			emitter_json_kv(emitter, "size", emitter_type_size,
			    &sv);

			CTL_LEAF(arenas_bin_mib, 3, "nregs", &u32v, uint32_t);
			emitter_json_kv(emitter, "nregs", emitter_type_uint32,
			    &u32v);

			CTL_LEAF(arenas_bin_mib, 3, "slab_size", &sv, size_t);
			emitter_json_kv(emitter, "slab_size", emitter_type_size,
			    &sv);

			CTL_LEAF(arenas_bin_mib, 3, "nshards", &u32v, uint32_t);
			emitter_json_kv(emitter, "nshards", emitter_type_uint32,
			    &u32v);

			emitter_json_object_end(emitter);
		}
		emitter_json_array_end(emitter); /* Close "bin". */
	}

	unsigned nlextents;
	CTL_GET("arenas.nlextents", &nlextents, unsigned);
	emitter_kv(emitter, "nlextents", "Number of large size classes",
	    emitter_type_unsigned, &nlextents);

	if (emitter_outputs_json(emitter)) {
		emitter_json_array_kv_begin(emitter, "lextent");
		size_t arenas_lextent_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(arenas_lextent_mib, 0, "arenas.lextent");
		for (unsigned i = 0; i < nlextents; i++) {
			arenas_lextent_mib[2] = i;
			emitter_json_object_begin(emitter);

			CTL_LEAF(arenas_lextent_mib, 3, "size", &sv, size_t);
			emitter_json_kv(emitter, "size", emitter_type_size,
			    &sv);

			emitter_json_object_end(emitter);
		}
		emitter_json_array_end(emitter); /* Close "lextent". */
	}

	emitter_json_object_end(emitter); /* Close "arenas" */
}